

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaSAXPlugPtr
xmlSchemaSAXPlug(xmlSchemaValidCtxtPtr ctxt,xmlSAXHandlerPtr *sax,void **user_data)

{
  xmlSAXHandlerPtr pxVar1;
  xmlSAXHandlerPtr old_sax;
  xmlSchemaSAXPlugPtr ret;
  void **user_data_local;
  xmlSAXHandlerPtr *sax_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlSchemaValidCtxtPtr)0x0) || (sax == (xmlSAXHandlerPtr *)0x0)) ||
     (user_data == (void **)0x0)) {
    ctxt_local = (xmlSchemaValidCtxtPtr)0x0;
  }
  else {
    pxVar1 = *sax;
    if ((pxVar1 == (xmlSAXHandlerPtr)0x0) || (pxVar1->initialized == 0xdeedbeaf)) {
      if (((pxVar1 == (xmlSAXHandlerPtr)0x0) ||
          ((pxVar1->startElementNs != (startElementNsSAX2Func)0x0 ||
           (pxVar1->endElementNs != (endElementNsSAX2Func)0x0)))) ||
         ((pxVar1->startElement == (startElementSAXFunc)0x0 &&
          (pxVar1->endElement == (endElementSAXFunc)0x0)))) {
        ctxt_local = (xmlSchemaValidCtxtPtr)(*xmlMalloc)(0x130);
        if (ctxt_local == (xmlSchemaValidCtxtPtr)0x0) {
          ctxt_local = (xmlSchemaValidCtxtPtr)0x0;
        }
        else {
          memset(ctxt_local,0,0x130);
          ctxt_local->type = -0x23bc45df;
          ctxt_local->nbIdcKeys = -0x21124151;
          *(xmlSchemaValidCtxtPtr *)&ctxt_local->nbAttrInfos = ctxt;
          ctxt_local->errCtxt = sax;
          ctxt_local->error = (xmlSchemaValidityErrorFunc)pxVar1;
          if (pxVar1 == (xmlSAXHandlerPtr)0x0) {
            ctxt_local->dict = (xmlDictPtr)xmlSchemaSAXHandleStartElementNs;
            ctxt_local->reader = (xmlTextReaderPtr)xmlSchemaSAXHandleEndElementNs;
            *(code **)&ctxt_local->sizeElemInfos = xmlSchemaSAXHandleText;
            ctxt_local->elemInfos = (xmlSchemaNodeInfoPtr *)xmlSchemaSAXHandleText;
            *(code **)&ctxt_local->nbIdcNodes = xmlSchemaSAXHandleCDataSection;
            *(code **)&ctxt_local->xsiAssemble = xmlSchemaSAXHandleReference;
            ctxt_local->serror = (xmlStructuredErrorFunc)ctxt;
            *user_data = ctxt;
          }
          else {
            if (pxVar1->internalSubset != (internalSubsetSAXFunc)0x0) {
              ctxt_local->schema = (xmlSchemaPtr)internalSubsetSplit;
            }
            if (pxVar1->isStandalone != (isStandaloneSAXFunc)0x0) {
              ctxt_local->doc = (xmlDocPtr)isStandaloneSplit;
            }
            if (pxVar1->hasInternalSubset != (hasInternalSubsetSAXFunc)0x0) {
              ctxt_local->input = (xmlParserInputBufferPtr)hasInternalSubsetSplit;
            }
            if (pxVar1->hasExternalSubset != (hasExternalSubsetSAXFunc)0x0) {
              *(code **)&ctxt_local->enc = hasExternalSubsetSplit;
            }
            if (pxVar1->resolveEntity != (resolveEntitySAXFunc)0x0) {
              ctxt_local->sax = (xmlSAXHandlerPtr)resolveEntitySplit;
            }
            if (pxVar1->getEntity != (getEntitySAXFunc)0x0) {
              ctxt_local->parserCtxt = (xmlParserCtxtPtr)getEntitySplit;
            }
            if (pxVar1->entityDecl != (entityDeclSAXFunc)0x0) {
              ctxt_local->user_data = entityDeclSplit;
            }
            if (pxVar1->notationDecl != (notationDeclSAXFunc)0x0) {
              ctxt_local->filename = (char *)notationDeclSplit;
            }
            if (pxVar1->attributeDecl != (attributeDeclSAXFunc)0x0) {
              *(code **)&ctxt_local->err = attributeDeclSplit;
            }
            if (pxVar1->elementDecl != (elementDeclSAXFunc)0x0) {
              ctxt_local->node = (xmlNodePtr)elementDeclSplit;
            }
            if (pxVar1->unparsedEntityDecl != (unparsedEntityDeclSAXFunc)0x0) {
              ctxt_local->cur = (xmlNodePtr)unparsedEntityDeclSplit;
            }
            if (pxVar1->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0) {
              ctxt_local->regexp = (xmlRegExecCtxtPtr)setDocumentLocatorSplit;
            }
            if (pxVar1->startDocument != (startDocumentSAXFunc)0x0) {
              ctxt_local->value = (xmlSchemaValPtr)startDocumentSplit;
            }
            if (pxVar1->endDocument != (endDocumentSAXFunc)0x0) {
              *(code **)&ctxt_local->valueWS = endDocumentSplit;
            }
            if (pxVar1->processingInstruction != (processingInstructionSAXFunc)0x0) {
              ctxt_local->inode = (xmlSchemaNodeInfoPtr)processingInstructionSplit;
            }
            if (pxVar1->comment != (commentSAXFunc)0x0) {
              ctxt_local->aidcs = (xmlSchemaIDCAugPtr_conflict)commentSplit;
            }
            if (pxVar1->warning != (warningSAXFunc)0x0) {
              ctxt_local->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)warningSplit;
            }
            if (pxVar1->error != (errorSAXFunc)0x0) {
              ctxt_local->xpathStatePool = (xmlSchemaIDCStateObjPtr_conflict)errorSplit;
            }
            if (pxVar1->fatalError != (fatalErrorSAXFunc)0x0) {
              ctxt_local->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)fatalErrorSplit;
            }
            if (pxVar1->getParameterEntity != (getParameterEntitySAXFunc)0x0) {
              ctxt_local->idcNodes = (xmlSchemaPSVIIDCNodePtr *)getParameterEntitySplit;
            }
            if (pxVar1->externalSubset != (externalSubsetSAXFunc)0x0) {
              ctxt_local->idcKeys = (xmlSchemaPSVIIDCKeyPtr *)externalSubsetSplit;
            }
            ctxt_local->elemInfos = (xmlSchemaNodeInfoPtr *)charactersSplit;
            if ((pxVar1->ignorableWhitespace == (ignorableWhitespaceSAXFunc)0x0) ||
               (pxVar1->ignorableWhitespace == pxVar1->characters)) {
              *(code **)&ctxt_local->sizeElemInfos = charactersSplit;
            }
            else {
              *(code **)&ctxt_local->sizeElemInfos = ignorableWhitespaceSplit;
            }
            *(code **)&ctxt_local->nbIdcNodes = cdataBlockSplit;
            *(code **)&ctxt_local->xsiAssemble = referenceSplit;
            ctxt_local->dict = (xmlDictPtr)startElementNsSplit;
            ctxt_local->reader = (xmlTextReaderPtr)endElementNsSplit;
            ctxt_local->warning = (xmlSchemaValidityWarningFunc)user_data;
            ctxt_local->serror = (xmlStructuredErrorFunc)*user_data;
            *user_data = ctxt_local;
          }
          *sax = (xmlSAXHandlerPtr)&ctxt_local->schema;
          ctxt->sax = *sax;
          ctxt->flags = ctxt->flags | 1;
          xmlSchemaPreRun(ctxt);
        }
      }
      else {
        ctxt_local = (xmlSchemaValidCtxtPtr)0x0;
      }
    }
    else {
      ctxt_local = (xmlSchemaValidCtxtPtr)0x0;
    }
  }
  return (xmlSchemaSAXPlugPtr)ctxt_local;
}

Assistant:

xmlSchemaSAXPlugPtr
xmlSchemaSAXPlug(xmlSchemaValidCtxtPtr ctxt,
		 xmlSAXHandlerPtr *sax, void **user_data)
{
    xmlSchemaSAXPlugPtr ret;
    xmlSAXHandlerPtr old_sax;

    if ((ctxt == NULL) || (sax == NULL) || (user_data == NULL))
        return(NULL);

    /*
     * We only allow to plug into SAX2 event streams
     */
    old_sax = *sax;
    if ((old_sax != NULL) && (old_sax->initialized != XML_SAX2_MAGIC))
        return(NULL);
    if ((old_sax != NULL) &&
        (old_sax->startElementNs == NULL) && (old_sax->endElementNs == NULL) &&
        ((old_sax->startElement != NULL) || (old_sax->endElement != NULL)))
        return(NULL);

    /*
     * everything seems right allocate the local data needed for that layer
     */
    ret = (xmlSchemaSAXPlugPtr) xmlMalloc(sizeof(xmlSchemaSAXPlugStruct));
    if (ret == NULL) {
        return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaSAXPlugStruct));
    ret->magic = XML_SAX_PLUG_MAGIC;
    ret->schemas_sax.initialized = XML_SAX2_MAGIC;
    ret->ctxt = ctxt;
    ret->user_sax_ptr = sax;
    ret->user_sax = old_sax;
    if (old_sax == NULL) {
        /*
	 * go direct, no need for the split block and functions.
	 */
	ret->schemas_sax.startElementNs = xmlSchemaSAXHandleStartElementNs;
	ret->schemas_sax.endElementNs = xmlSchemaSAXHandleEndElementNs;
	/*
	 * Note that we use the same text-function for both, to prevent
	 * the parser from testing for ignorable whitespace.
	 */
	ret->schemas_sax.ignorableWhitespace = xmlSchemaSAXHandleText;
	ret->schemas_sax.characters = xmlSchemaSAXHandleText;

	ret->schemas_sax.cdataBlock = xmlSchemaSAXHandleCDataSection;
	ret->schemas_sax.reference = xmlSchemaSAXHandleReference;

	ret->user_data = ctxt;
	*user_data = ctxt;
    } else {
       /*
        * for each callback unused by Schemas initialize it to the Split
	* routine only if non NULL in the user block, this can speed up
	* things at the SAX level.
	*/
        if (old_sax->internalSubset != NULL)
            ret->schemas_sax.internalSubset = internalSubsetSplit;
        if (old_sax->isStandalone != NULL)
            ret->schemas_sax.isStandalone = isStandaloneSplit;
        if (old_sax->hasInternalSubset != NULL)
            ret->schemas_sax.hasInternalSubset = hasInternalSubsetSplit;
        if (old_sax->hasExternalSubset != NULL)
            ret->schemas_sax.hasExternalSubset = hasExternalSubsetSplit;
        if (old_sax->resolveEntity != NULL)
            ret->schemas_sax.resolveEntity = resolveEntitySplit;
        if (old_sax->getEntity != NULL)
            ret->schemas_sax.getEntity = getEntitySplit;
        if (old_sax->entityDecl != NULL)
            ret->schemas_sax.entityDecl = entityDeclSplit;
        if (old_sax->notationDecl != NULL)
            ret->schemas_sax.notationDecl = notationDeclSplit;
        if (old_sax->attributeDecl != NULL)
            ret->schemas_sax.attributeDecl = attributeDeclSplit;
        if (old_sax->elementDecl != NULL)
            ret->schemas_sax.elementDecl = elementDeclSplit;
        if (old_sax->unparsedEntityDecl != NULL)
            ret->schemas_sax.unparsedEntityDecl = unparsedEntityDeclSplit;
        if (old_sax->setDocumentLocator != NULL)
            ret->schemas_sax.setDocumentLocator = setDocumentLocatorSplit;
        if (old_sax->startDocument != NULL)
            ret->schemas_sax.startDocument = startDocumentSplit;
        if (old_sax->endDocument != NULL)
            ret->schemas_sax.endDocument = endDocumentSplit;
        if (old_sax->processingInstruction != NULL)
            ret->schemas_sax.processingInstruction = processingInstructionSplit;
        if (old_sax->comment != NULL)
            ret->schemas_sax.comment = commentSplit;
        if (old_sax->warning != NULL)
            ret->schemas_sax.warning = warningSplit;
        if (old_sax->error != NULL)
            ret->schemas_sax.error = errorSplit;
        if (old_sax->fatalError != NULL)
            ret->schemas_sax.fatalError = fatalErrorSplit;
        if (old_sax->getParameterEntity != NULL)
            ret->schemas_sax.getParameterEntity = getParameterEntitySplit;
        if (old_sax->externalSubset != NULL)
            ret->schemas_sax.externalSubset = externalSubsetSplit;

	/*
	 * the 6 schemas callback have to go to the splitter functions
	 * Note that we use the same text-function for ignorableWhitespace
	 * if possible, to prevent the parser from testing for ignorable
	 * whitespace.
	 */
        ret->schemas_sax.characters = charactersSplit;
	if ((old_sax->ignorableWhitespace != NULL) &&
	    (old_sax->ignorableWhitespace != old_sax->characters))
	    ret->schemas_sax.ignorableWhitespace = ignorableWhitespaceSplit;
	else
	    ret->schemas_sax.ignorableWhitespace = charactersSplit;
        ret->schemas_sax.cdataBlock = cdataBlockSplit;
        ret->schemas_sax.reference = referenceSplit;
        ret->schemas_sax.startElementNs = startElementNsSplit;
        ret->schemas_sax.endElementNs = endElementNsSplit;

	ret->user_data_ptr = user_data;
	ret->user_data = *user_data;
	*user_data = ret;
    }

    /*
     * plug the pointers back.
     */
    *sax = &(ret->schemas_sax);
    ctxt->sax = *sax;
    ctxt->flags |= XML_SCHEMA_VALID_CTXT_FLAG_STREAM;
    xmlSchemaPreRun(ctxt);
    return(ret);
}